

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_entropy.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  FILE *__s;
  int iVar2;
  uchar buf [64];
  mbedtls_entropy_context entropy;
  uchar auStack_478 [64];
  mbedtls_entropy_context local_438;
  
  if (argc < 2) {
    main_cold_1();
  }
  else {
    __s = fopen(argv[1],"wb+");
    if (__s != (FILE *)0x0) {
      mbedtls_entropy_init(&local_438);
      iVar2 = 1;
      do {
        uVar1 = mbedtls_entropy_func(&local_438,auStack_478,0x40);
        if (uVar1 != 0) {
          printf("  failed\n  !  mbedtls_entropy_func returned -%04X\n",(ulong)uVar1);
          iVar2 = 1;
          goto LAB_001023a2;
        }
        fwrite(auStack_478,1,0x40,__s);
        printf("Generating %ldkb of data in file \'%s\'... %04.1f%% done\r",
               (double)(((float)iVar2 * 100.0) / 768.0),0x30,argv[1]);
        fflush(_stdout);
        iVar2 = iVar2 + 1;
      } while (iVar2 != 0x301);
      iVar2 = 0;
LAB_001023a2:
      putchar(10);
      fclose(__s);
      mbedtls_entropy_free(&local_438);
      return iVar2;
    }
    printf("failed to open \'%s\' for writing.\n",argv[1]);
  }
  return 1;
}

Assistant:

int main( int argc, char *argv[] )
{
    FILE *f;
    int i, k, ret = 1;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    mbedtls_entropy_context entropy;
    unsigned char buf[MBEDTLS_ENTROPY_BLOCK_SIZE];

    if( argc < 2 )
    {
        mbedtls_fprintf( stderr, "usage: %s <output filename>\n", argv[0] );
        return( exit_code );
    }

    if( ( f = fopen( argv[1], "wb+" ) ) == NULL )
    {
        mbedtls_printf( "failed to open '%s' for writing.\n", argv[1] );
        return( exit_code );
    }

    mbedtls_entropy_init( &entropy );

    for( i = 0, k = 768; i < k; i++ )
    {
        ret = mbedtls_entropy_func( &entropy, buf, sizeof( buf ) );
        if( ret != 0 )
        {
            mbedtls_printf( "  failed\n  !  mbedtls_entropy_func returned -%04X\n",
                            ret );
            goto cleanup;
        }

        fwrite( buf, 1, sizeof( buf ), f );

        mbedtls_printf( "Generating %ldkb of data in file '%s'... %04.1f" \
                "%% done\r", (long)(sizeof(buf) * k / 1024), argv[1], (100 * (float) (i + 1)) / k );
        fflush( stdout );
    }

    exit_code = MBEDTLS_EXIT_SUCCESS;

cleanup:
    mbedtls_printf( "\n" );

    fclose( f );
    mbedtls_entropy_free( &entropy );

    return( exit_code );
}